

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this_00;
  char *pcVar1;
  ulong __n;
  char *pcVar2;
  nonfinite_writer<char> *in_RDX;
  int *in_RSI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  checked_ptr<typename_buffer<char>::value_type> *it;
  size_t num_code_points;
  size_t size;
  uint width;
  char **in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  char cVar3;
  checked_ptr<typename_buffer<char>::value_type> local_48;
  checked_ptr<typename_buffer<char>::value_type> *local_40;
  checked_ptr<typename_buffer<char>::value_type> local_38;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *local_30;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *local_28;
  type local_1c;
  nonfinite_writer<char> *local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = to_unsigned<int>(*in_RSI);
  this_00 = (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)
            nonfinite_writer<char>::size(local_18);
  local_28 = this_00;
  if (local_1c != 0) {
    this_00 = (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)
              nonfinite_writer<char>::width((nonfinite_writer<char> *)0xf075dd);
  }
  local_30 = this_00;
  if (this_00 < (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)(ulong)local_1c) {
    local_48 = basic_writer<duckdb_fmt::v6::buffer_range<char>_>::reserve
                         (this_00,(size_t)in_stack_ffffffffffffff88);
    local_40 = &local_48;
    pcVar1 = fill_t<char>::operator[]((fill_t<char> *)((long)local_10 + 10),0);
    cVar3 = *pcVar1;
    __n = (ulong)local_1c - (long)local_30;
    if ((*(byte *)((long)local_10 + 9) & 0xf) == 2) {
      pcVar1 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(cVar3,in_stack_ffffffffffffffb0),__n,
                          in_stack_ffffffffffffffa0);
      *local_40 = pcVar1;
      nonfinite_writer<char>::operator()
                ((nonfinite_writer<char> *)this_00,in_stack_ffffffffffffff88);
    }
    else if ((*(byte *)((long)local_10 + 9) & 0xf) == 3) {
      pcVar1 = (char *)(__n >> 1);
      pcVar2 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(cVar3,in_stack_ffffffffffffffb0),__n,pcVar1);
      *local_40 = pcVar2;
      nonfinite_writer<char>::operator()
                ((nonfinite_writer<char> *)this_00,in_stack_ffffffffffffff88);
      pcVar1 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(cVar3,in_stack_ffffffffffffffb0),__n,pcVar1);
      *local_40 = pcVar1;
    }
    else {
      nonfinite_writer<char>::operator()
                ((nonfinite_writer<char> *)this_00,in_stack_ffffffffffffff88);
      pcVar1 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(cVar3,in_stack_ffffffffffffffb0),__n,
                          in_stack_ffffffffffffffa0);
      *local_40 = pcVar1;
    }
  }
  else {
    local_38 = basic_writer<duckdb_fmt::v6::buffer_range<char>_>::reserve(this_00,(size_t)local_18);
    nonfinite_writer<char>::operator()((nonfinite_writer<char> *)this_00,(char **)local_18);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }